

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::PostResolutionChecks::checkPropertyValue(Expression *value)

{
  int iVar1;
  Constant *pCVar2;
  pool_ptr<soul::AST::Constant> constValue;
  Type type;
  pool_ptr<soul::AST::Constant> local_a0;
  char local_98 [4];
  uint local_94;
  RefCountedPtr<soul::Structure> local_88;
  CompileMessage local_80;
  CompileMessage local_48;
  
  iVar1 = (*(value->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
  if ((char)iVar1 == '\0') {
    Errors::propertyMustBeConstant<>();
    AST::Context::throwError(&(value->super_Statement).super_ASTObject.context,&local_48,false);
  }
  (*(value->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_a0,value);
  if (local_a0.object != (Constant *)0x0) {
    pCVar2 = pool_ptr<soul::AST::Constant>::operator->(&local_a0);
    (*(pCVar2->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
              (local_98,pCVar2);
    if (((local_94 & 0xfffffffe) != 2 || local_98[0] != '\x01') &&
       (local_98[0] != '\a' && (2 < local_94 - 7 || local_98[0] != '\x01'))) {
      Errors::illegalPropertyType<>();
      AST::Context::throwError(&(value->super_Statement).super_ASTObject.context,&local_80,false);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_88);
  }
  return;
}

Assistant:

static void checkPropertyValue (AST::Expression& value)
        {
            if (! value.isCompileTimeConstant())
                value.context.throwError (Errors::propertyMustBeConstant());

            if (auto constValue = value.getAsConstant())
            {
                auto type = constValue->getResultType();

                if (! (type.isPrimitiveFloat() || type.isPrimitiveInteger()
                        || type.isPrimitiveBool() || type.isStringLiteral()))
                    value.context.throwError (Errors::illegalPropertyType());
            }
        }